

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

int psa_cmac_setup(psa_mac_operation_t *operation,size_t key_bits,psa_key_slot_t *slot,
                  mbedtls_cipher_info_t *cipher_info)

{
  int iVar1;
  
  operation->mac_size = (uint8_t)cipher_info->block_size;
  iVar1 = mbedtls_cipher_setup(&(operation->ctx).cmac,cipher_info);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mbedtls_cipher_cmac_starts(&(operation->ctx).cmac,(slot->data).raw.data,key_bits);
  return iVar1;
}

Assistant:

static int psa_cmac_setup( psa_mac_operation_t *operation,
                           size_t key_bits,
                           psa_key_slot_t *slot,
                           const mbedtls_cipher_info_t *cipher_info )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    operation->mac_size = cipher_info->block_size;

    ret = mbedtls_cipher_setup( &operation->ctx.cmac, cipher_info );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_cipher_cmac_starts( &operation->ctx.cmac,
                                      slot->data.raw.data,
                                      key_bits );
    return( ret );
}